

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.c
# Opt level: O0

void md5_block_pad(md5_block *blk,BinarySink *bs)

{
  uint64_t uVar1;
  undefined1 local_30 [8];
  uchar buf [8];
  size_t pad;
  uint64_t final_len;
  BinarySink *bs_local;
  md5_block *blk_local;
  
  uVar1 = blk->len;
  buf = (uchar  [8])(0x37 - blk->used & 0x3f);
  BinarySink_put_byte(bs->binarysink_,0x80);
  BinarySink_put_padding(bs->binarysink_,(size_t)buf,'\0');
  PUT_64BIT_LSB_FIRST(local_30,uVar1 << 3);
  BinarySink_put_data(bs->binarysink_,local_30,8);
  smemclr(local_30,8);
  if (blk->used != 0) {
    __assert_fail("blk->used == 0 && \"Should have exactly hit a block boundary\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/md5.c",
                  0x61,"void md5_block_pad(md5_block *, BinarySink *)");
  }
  return;
}

Assistant:

static inline void md5_block_pad(md5_block *blk, BinarySink *bs)
{
    uint64_t final_len = blk->len << 3;
    size_t pad = 63 & (55 - blk->used);

    put_byte(bs, 0x80);
    put_padding(bs, pad, 0);

    unsigned char buf[8];
    PUT_64BIT_LSB_FIRST(buf, final_len);
    put_data(bs, buf, 8);
    smemclr(buf, 8);

    assert(blk->used == 0 && "Should have exactly hit a block boundary");
}